

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

LArYieldResult * __thiscall
NEST::LArNEST::LegacyGetYields
          (LArYieldResult *__return_storage_ptr__,LArNEST *this,double energy,double efield,
          double yieldFactor,double excitationRatio,double epsilon,double recombProb)

{
  RandomGen *pRVar1;
  int64_t iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double Ne;
  double Nph;
  double Nion;
  double Nex;
  double dStack_58;
  int Nq;
  double leftvar;
  double sigma;
  double MeanNq;
  double recombProb_local;
  double epsilon_local;
  double excitationRatio_local;
  double yieldFactor_local;
  double efield_local;
  double energy_local;
  LArNEST *this_local;
  
  dVar3 = sqrt(energy * 51282.05128205128 * 0.107);
  pRVar1 = RandomGen::rndm();
  dStack_58 = RandomGen::rand_gauss(pRVar1,yieldFactor,yieldFactor * 0.25,true);
  if (1.0 < dStack_58) {
    dStack_58 = 1.0;
  }
  pRVar1 = RandomGen::rndm();
  dVar3 = RandomGen::rand_gauss(pRVar1,energy * 51282.05128205128,dVar3,true);
  dVar3 = floor(dVar3 + 0.5);
  Nex._4_4_ = (int)dVar3;
  if (yieldFactor < 1.0) {
    pRVar1 = RandomGen::rndm();
    iVar2 = RandomGen::binom_draw(pRVar1,(long)Nex._4_4_,dStack_58);
    Nex._4_4_ = (int)iVar2;
  }
  if ((energy < 1.95e-05) || (Nex._4_4_ < 0)) {
    Nex._4_4_ = 0;
  }
  pRVar1 = RandomGen::rndm();
  iVar2 = RandomGen::binom_draw(pRVar1,(long)Nex._4_4_,excitationRatio / (excitationRatio + 1.0));
  dVar3 = (double)iVar2;
  pRVar1 = RandomGen::rndm();
  iVar2 = RandomGen::binom_draw(pRVar1,(long)((double)Nex._4_4_ - dVar3),recombProb);
  dVar4 = dVar3 + (double)iVar2;
  dVar5 = (double)Nex._4_4_ - dVar4;
  __return_storage_ptr__->TotalYield = (dVar5 + dVar4) / energy;
  __return_storage_ptr__->QuantaYield = dVar5 / energy;
  __return_storage_ptr__->LightYield = dVar4 / energy;
  __return_storage_ptr__->Nph = dVar4;
  __return_storage_ptr__->Ne = dVar5;
  __return_storage_ptr__->Nex = dVar3;
  __return_storage_ptr__->Nion = (double)Nex._4_4_ - dVar3;
  __return_storage_ptr__->Lindhard = 0.0;
  __return_storage_ptr__->ElectricField = efield;
  return __return_storage_ptr__;
}

Assistant:

LArYieldResult LArNEST::LegacyGetYields(double energy, double efield,
                                        double yieldFactor,
                                        double excitationRatio, double epsilon,
                                        double recombProb) {
  // determine ultimate number of quanta from current E-deposition (ph+e-)
  // total mean number of exc/ions the total number of either quanta produced
  // is equal to product of the work function, the energy deposited,
  // and yield reduction, for NR
  double MeanNq = legacy_scint_yield * energy;
  double sigma = sqrt(legacy_resolution_scale * MeanNq);  // Fano
  double leftvar =
      RandomGen::rndm()->rand_gauss(yieldFactor, 0.25 * yieldFactor, true);
  if (leftvar > 1.0) {
    leftvar = 1.0;
  }
  int Nq = int(floor(RandomGen::rndm()->rand_gauss(MeanNq, sigma, true) + 0.5));
  if (yieldFactor < 1) {
    Nq = RandomGen::rndm()->binom_draw(Nq, leftvar);
  }

  // if Edep below work function, can't make any quanta, and if Nq
  // less than zero because Gaussian fluctuated low, update to zero
  if (energy < 1 / legacy_scint_yield || Nq < 0) {
    Nq = 0;
  }

  // next section binomially assigns quanta to excitons and ions
  double Nex = RandomGen::rndm()->binom_draw(
      Nq, excitationRatio / (1 + excitationRatio));
  double Nion = Nq - Nex;

  // use binomial distribution to assign photons, electrons, where photons
  // are excitons plus recombined ionization electrons, while final
  // collected electrons are the "escape" (non-recombined) electrons
  double Nph = Nex + RandomGen::rndm()->binom_draw(Nion, recombProb);
  double Ne = Nq - Nph;

  // create the quanta results
  LArYieldResult result{(Ne + Nph) / energy,
                        Ne / energy,
                        Nph / energy,
                        Nph,
                        Ne,
                        Nex,
                        Nion,
                        0.0,
                        efield};
  return result;
}